

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_finalize(Context *ctx)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_30;
  uint local_18;
  int commas;
  int uniform_count;
  Context *ctx_local;
  
  if (ctx->have_relative_input_registers != 0) {
    fail(ctx,"Relative addressing of input registers not supported.");
  }
  push_output(ctx,&ctx->preflight);
  if (ctx->metal_need_header_common != 0) {
    output_line(ctx,"#include <metal_common>");
  }
  if (ctx->metal_need_header_math != 0) {
    output_line(ctx,"#include <metal_math>");
  }
  if (ctx->metal_need_header_relational != 0) {
    output_line(ctx,"#include <metal_relational>");
  }
  if (ctx->metal_need_header_geometric != 0) {
    output_line(ctx,"#include <metal_geometric>");
  }
  if (ctx->metal_need_header_graphics != 0) {
    output_line(ctx,"#include <metal_graphics>");
  }
  if (ctx->metal_need_header_texture != 0) {
    output_line(ctx,"#include <metal_texture>");
  }
  output_blank_line(ctx);
  output_line(ctx,"using namespace metal;");
  output_blank_line(ctx);
  pop_output(ctx);
  push_output(ctx,&ctx->mainline_intro);
  iVar1 = shader_is_vertex(ctx);
  pcVar2 = "fragment";
  if (iVar1 != 0) {
    pcVar2 = "vertex";
  }
  if (ctx->outputs == (Buffer *)0x0) {
    local_30 = "void";
  }
  else {
    local_30 = ctx->mainfn;
  }
  pcVar3 = "";
  if (ctx->outputs != (Buffer *)0x0) {
    pcVar3 = "_Output";
  }
  output_line(ctx,"%s %s%s %s (",pcVar2,local_30,pcVar3,ctx->mainfn);
  pop_output(ctx);
  push_output(ctx,&ctx->mainline_arguments);
  ctx->indent = ctx->indent + 1;
  iVar1 = ctx->uniform_float4_count + ctx->uniform_int4_count + ctx->uniform_bool_count;
  local_18 = (uint)(iVar1 != 0);
  if (ctx->inputs != (Buffer *)0x0) {
    local_18 = local_18 + 1;
  }
  if (local_18 != 0) {
    local_18 = local_18 - 1;
  }
  if (0 < iVar1) {
    push_output(ctx,&ctx->globals);
    output_line(ctx,"struct %s_Uniforms",ctx->mainfn);
    output_line(ctx,"{");
    ctx->indent = ctx->indent + 1;
    if (0 < ctx->uniform_float4_count) {
      output_line(ctx,"float4 uniforms_float4[%d];",(ulong)(uint)ctx->uniform_float4_count);
    }
    if (0 < ctx->uniform_int4_count) {
      output_line(ctx,"int4 uniforms_int4[%d];",(ulong)(uint)ctx->uniform_int4_count);
    }
    if (0 < ctx->uniform_bool_count) {
      output_line(ctx,"bool uniforms_bool[%d];",(ulong)(uint)ctx->uniform_bool_count);
    }
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"};");
    pop_output(ctx);
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = ",";
    }
    output_line(ctx,"constant %s_Uniforms &uniforms [[buffer(16)]]%s",ctx->mainfn,pcVar2);
    local_18 = local_18 - 1;
  }
  if (ctx->inputs != (Buffer *)0x0) {
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = ",";
    }
    output_line(ctx,"%s_Input input [[stage_in]]%s",ctx->mainfn,pcVar2);
  }
  ctx->indent = ctx->indent + -1;
  output_line(ctx,") {");
  if (ctx->outputs != (Buffer *)0x0) {
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"%s_Output output;",ctx->mainfn);
    push_output(ctx,&ctx->mainline);
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"return output;");
    pop_output(ctx);
  }
  pop_output(ctx);
  if (ctx->inputs != (Buffer *)0x0) {
    push_output(ctx,&ctx->inputs);
    output_line(ctx,"};");
    output_blank_line(ctx);
    pop_output(ctx);
  }
  if (ctx->outputs != (Buffer *)0x0) {
    push_output(ctx,&ctx->outputs);
    output_line(ctx,"};");
    output_blank_line(ctx);
    pop_output(ctx);
  }
  if (ctx->globals != (Buffer *)0x0) {
    push_output(ctx,&ctx->globals);
    output_blank_line(ctx);
    pop_output(ctx);
  }
  return;
}

Assistant:

static void emit_METAL_finalize(Context *ctx)
{
    // If we had a relative addressing of REG_TYPE_INPUT, we need to build
    //  an array for it at the start of main(). GLSL doesn't let you specify
    //  arrays of attributes.
    //float4 blah_array[BIGGEST_ARRAY];
    if (ctx->have_relative_input_registers) // !!! FIXME
        fail(ctx, "Relative addressing of input registers not supported.");

    // Insert header includes we need...
    push_output(ctx, &ctx->preflight);
    #define INC_METAL_HEADER(name) \
        if (ctx->metal_need_header_##name) { \
            output_line(ctx, "#include <metal_" #name ">"); \
        }
    INC_METAL_HEADER(common);
    INC_METAL_HEADER(math);
    INC_METAL_HEADER(relational);
    INC_METAL_HEADER(geometric);
    INC_METAL_HEADER(graphics);
    INC_METAL_HEADER(texture);
    #undef INC_METAL_HEADER
    output_blank_line(ctx);
    output_line(ctx, "using namespace metal;");
    output_blank_line(ctx);
    pop_output(ctx);

    // Fill in the shader's mainline function signature.
    push_output(ctx, &ctx->mainline_intro);
    output_line(ctx, "%s %s%s %s (",
                shader_is_vertex(ctx) ? "vertex" : "fragment",
                ctx->outputs ? ctx->mainfn : "void",
                ctx->outputs ? "_Output" : "", ctx->mainfn);
    pop_output(ctx);

    push_output(ctx, &ctx->mainline_arguments);
    ctx->indent++;

    const int uniform_count = ctx->uniform_float4_count + ctx->uniform_int4_count + ctx->uniform_bool_count;
    int commas = 0;
    if (uniform_count) commas++;
    if (ctx->inputs) commas++;
    if (commas) commas--;

    if (uniform_count > 0)
    {
        push_output(ctx, &ctx->globals);
        output_line(ctx, "struct %s_Uniforms", ctx->mainfn);
        output_line(ctx, "{");
        ctx->indent++;
        if (ctx->uniform_float4_count > 0)
            output_line(ctx, "float4 uniforms_float4[%d];", ctx->uniform_float4_count);
        if (ctx->uniform_int4_count > 0)
            output_line(ctx, "int4 uniforms_int4[%d];", ctx->uniform_int4_count);
        if (ctx->uniform_bool_count > 0)
            output_line(ctx, "bool uniforms_bool[%d];", ctx->uniform_bool_count);
        ctx->indent--;
        output_line(ctx, "};");
        pop_output(ctx);

        output_line(ctx, "constant %s_Uniforms &uniforms [[buffer(16)]]%s", ctx->mainfn, commas ? "," : "");
        commas--;
    } // if

    if (ctx->inputs)
    {
        output_line(ctx, "%s_Input input [[stage_in]]%s", ctx->mainfn, commas ? "," : "");
        commas--;
    } // if

    ctx->indent--;
    output_line(ctx, ") {");
    if (ctx->outputs)
    {
        ctx->indent++;
        output_line(ctx, "%s_Output output;", ctx->mainfn);

        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "return output;");
        pop_output(ctx);
    } // if
    pop_output(ctx);

    if (ctx->inputs)
    {
        push_output(ctx, &ctx->inputs);
        output_line(ctx, "};");
        output_blank_line(ctx);
        pop_output(ctx);
    } // if

    if (ctx->outputs)
    {
        push_output(ctx, &ctx->outputs);
        output_line(ctx, "};");
        output_blank_line(ctx);
        pop_output(ctx);
    } // if

    // throw some blank lines around to make source more readable.
    if (ctx->globals)  // don't add a blank line if the section is empty.
    {
        push_output(ctx, &ctx->globals);
        output_blank_line(ctx);
        pop_output(ctx);
    } // if
}